

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

void __thiscall CppGenerator::genMainFunction(CppGenerator *this,bool parallelize)

{
  undefined8 *puVar1;
  bool bVar2;
  char cVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_t sVar6;
  TDNode *pTVar7;
  ostream *poVar8;
  char *pcVar9;
  ulong *puVar10;
  size_type *psVar11;
  ulong uVar12;
  long *plVar13;
  char *pcVar14;
  char cVar15;
  undefined7 in_register_00000031;
  long lVar16;
  size_t viewID;
  ulong uVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  ofstream ofs;
  string local_458;
  undefined4 local_438;
  string local_430;
  ulong *local_410;
  long local_408;
  ulong local_400;
  long lStack_3f8;
  long *local_3f0;
  long local_3e8;
  long local_3e0;
  long lStack_3d8;
  ulong *local_3d0;
  long local_3c8;
  ulong local_3c0;
  long lStack_3b8;
  long *local_3b0;
  long local_3a8;
  long local_3a0;
  long lStack_398;
  ulong *local_390;
  long local_388;
  ulong local_380;
  long lStack_378;
  ulong *local_370;
  long local_368;
  ulong local_360 [2];
  undefined8 *local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0 [2];
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0 [2];
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0 [2];
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_438 = (undefined4)CONCAT71(in_register_00000031,parallelize);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_458,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_458);
  std::ofstream::ofstream(&local_230,(string *)&local_458,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  local_3f0 = &local_3e0;
  std::__cxx11::string::_M_construct((ulong)&local_3f0,'\x03');
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,0x2afc04);
  local_410 = &local_400;
  puVar10 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar10) {
    local_400 = *puVar10;
    lStack_3f8 = plVar4[3];
  }
  else {
    local_400 = *puVar10;
    local_410 = (ulong *)*plVar4;
  }
  local_408 = plVar4[1];
  *plVar4 = (long)puVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_410);
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  psVar11 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_430.field_2._M_allocated_capacity = *psVar11;
    local_430.field_2._8_8_ = plVar4[3];
  }
  else {
    local_430.field_2._M_allocated_capacity = *psVar11;
    local_430._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_430._M_string_length = plVar4[1];
  *plVar4 = (long)psVar11;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_430);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  psVar11 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_458.field_2._M_allocated_capacity = *psVar11;
    local_458.field_2._8_8_ = plVar4[3];
  }
  else {
    local_458.field_2._M_allocated_capacity = *psVar11;
    local_458._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_458._M_string_length = plVar4[1];
  *plVar4 = (long)psVar11;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,local_458._M_dataplus._M_p,local_458._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if (local_410 != &local_400) {
    operator_delete(local_410);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"#include \"DataHandler.h\"\n",0x19);
  if ((this->viewGroups).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->viewGroups).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar17 = 0;
    do {
      cVar15 = '\x01';
      local_410 = &local_400;
      if (9 < uVar17) {
        uVar12 = uVar17;
        cVar3 = '\x04';
        do {
          cVar15 = cVar3;
          if (uVar12 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_001f3a91;
          }
          if (uVar12 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_001f3a91;
          }
          if (uVar12 < 10000) goto LAB_001f3a91;
          bVar2 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar3 = cVar15 + '\x04';
        } while (bVar2);
        cVar15 = cVar15 + '\x01';
      }
LAB_001f3a91:
      std::__cxx11::string::_M_construct((ulong)&local_410,cVar15);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_410,(uint)local_408,uVar17);
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,0x2ad29f)
      ;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      psVar11 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_430.field_2._M_allocated_capacity = *psVar11;
        local_430.field_2._8_8_ = puVar5[3];
      }
      else {
        local_430.field_2._M_allocated_capacity = *psVar11;
        local_430._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_430._M_string_length = puVar5[1];
      *puVar5 = psVar11;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      psVar11 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_458.field_2._M_allocated_capacity = *psVar11;
        local_458.field_2._8_8_ = puVar5[3];
      }
      else {
        local_458.field_2._M_allocated_capacity = *psVar11;
        local_458._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_458._M_string_length = puVar5[1];
      *puVar5 = psVar11;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,local_458._M_dataplus._M_p,local_458._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p);
      }
      if (local_410 != &local_400) {
        operator_delete(local_410);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)(((long)(this->viewGroups).
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->viewGroups).
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  if (this->_hasApplicationHandler != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"#include \"ApplicationHandler.h\"\n",0x20);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"\nnamespace lmfao\n{\n",0x13);
  uVar17 = 0;
  while( true ) {
    sVar6 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar6 <= uVar17) break;
    pTVar7 = TreeDecomposition::getRelation
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar17);
    local_3b0 = &local_3a0;
    std::__cxx11::string::_M_construct((ulong)&local_3b0,'\x03');
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_3b0);
    local_3d0 = &local_3c0;
    puVar10 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar10) {
      local_3c0 = *puVar10;
      lStack_3b8 = plVar4[3];
    }
    else {
      local_3c0 = *puVar10;
      local_3d0 = (ulong *)*plVar4;
    }
    local_3c8 = plVar4[1];
    *plVar4 = (long)puVar10;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_3d0,(ulong)(pTVar7->_name)._M_dataplus._M_p);
    local_3f0 = &local_3e0;
    plVar13 = plVar4 + 2;
    if ((long *)*plVar4 == plVar13) {
      local_3e0 = *plVar13;
      lStack_3d8 = plVar4[3];
    }
    else {
      local_3e0 = *plVar13;
      local_3f0 = (long *)*plVar4;
    }
    local_3e8 = plVar4[1];
    *plVar4 = (long)plVar13;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f0);
    local_410 = &local_400;
    puVar10 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar10) {
      local_400 = *puVar10;
      lStack_3f8 = puVar5[3];
    }
    else {
      local_400 = *puVar10;
      local_410 = (ulong *)*puVar5;
    }
    local_408 = puVar5[1];
    *puVar5 = puVar10;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_410,(ulong)(pTVar7->_name)._M_dataplus._M_p);
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    psVar11 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_430.field_2._M_allocated_capacity = *psVar11;
      local_430.field_2._8_8_ = puVar5[3];
    }
    else {
      local_430.field_2._M_allocated_capacity = *psVar11;
      local_430._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_430._M_string_length = puVar5[1];
    *puVar5 = psVar11;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    psVar11 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_458.field_2._M_allocated_capacity = *psVar11;
      local_458.field_2._8_8_ = puVar5[3];
    }
    else {
      local_458.field_2._M_allocated_capacity = *psVar11;
      local_458._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_458._M_string_length = puVar5[1];
    *puVar5 = psVar11;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_458._M_dataplus._M_p,local_458._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    if (local_410 != &local_400) {
      operator_delete(local_410);
    }
    if (local_3f0 != &local_3e0) {
      operator_delete(local_3f0);
    }
    if (local_3d0 != &local_3c0) {
      operator_delete(local_3d0);
    }
    if (local_3b0 != &local_3a0) {
      operator_delete(local_3b0);
    }
    uVar17 = uVar17 + 1;
  }
  lVar16 = 8;
  uVar17 = 0;
  while( true ) {
    sVar6 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar6 <= uVar17) break;
    local_3b0 = &local_3a0;
    std::__cxx11::string::_M_construct((ulong)&local_3b0,'\x03');
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_3b0);
    local_3d0 = &local_3c0;
    puVar10 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar10) {
      local_3c0 = *puVar10;
      lStack_3b8 = puVar5[3];
    }
    else {
      local_3c0 = *puVar10;
      local_3d0 = (ulong *)*puVar5;
    }
    local_3c8 = puVar5[1];
    *puVar5 = puVar10;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_3d0,*(ulong *)((long)this->viewName + lVar16 + -8));
    local_3f0 = &local_3e0;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_3e0 = *plVar4;
      lStack_3d8 = puVar5[3];
    }
    else {
      local_3e0 = *plVar4;
      local_3f0 = (long *)*puVar5;
    }
    local_3e8 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f0);
    local_410 = &local_400;
    puVar10 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar10) {
      local_400 = *puVar10;
      lStack_3f8 = puVar5[3];
    }
    else {
      local_400 = *puVar10;
      local_410 = (ulong *)*puVar5;
    }
    local_408 = puVar5[1];
    *puVar5 = puVar10;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_410,*(ulong *)((long)this->viewName + lVar16 + -8));
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    psVar11 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_430.field_2._M_allocated_capacity = *psVar11;
      local_430.field_2._8_8_ = puVar5[3];
    }
    else {
      local_430.field_2._M_allocated_capacity = *psVar11;
      local_430._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_430._M_string_length = puVar5[1];
    *puVar5 = psVar11;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    psVar11 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_458.field_2._M_allocated_capacity = *psVar11;
      local_458.field_2._8_8_ = puVar5[3];
    }
    else {
      local_458.field_2._M_allocated_capacity = *psVar11;
      local_458._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_458._M_string_length = puVar5[1];
    *puVar5 = psVar11;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_458._M_dataplus._M_p,local_458._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    if (local_410 != &local_400) {
      operator_delete(local_410);
    }
    if (local_3f0 != &local_3e0) {
      operator_delete(local_3f0);
    }
    if (local_3d0 != &local_3c0) {
      operator_delete(local_3d0);
    }
    if (local_3b0 != &local_3a0) {
      operator_delete(local_3b0);
    }
    uVar17 = uVar17 + 1;
    lVar16 = lVar16 + 0x20;
  }
  genLoadRelationFunction_abi_cxx11_(&local_458,this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,local_458._M_dataplus._M_p,local_458._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  pcVar14 = (char *)0x0;
  while( true ) {
    local_430._M_dataplus._M_p = pcVar14;
    pcVar9 = (char *)TreeDecomposition::numberOfRelations
                               ((this->_td).
                                super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    if (pcVar9 <= pcVar14) break;
    genSortFunction_abi_cxx11_(&local_458,this,(size_t *)&local_430);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_458._M_dataplus._M_p,local_458._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p);
    }
    pcVar14 = pcVar14 + 1;
  }
  genRunFunction_abi_cxx11_(&local_458,this,local_438._0_1_);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,local_458._M_dataplus._M_p,local_458._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  genTestFunction_abi_cxx11_(&local_458,this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,local_458._M_dataplus._M_p,local_458._M_string_length);
  genDumpFunction_abi_cxx11_(&local_430,this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_430._M_dataplus._M_p,local_430._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\n\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct((ulong)local_250,'\x03');
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x2afc4c);
  plVar13 = plVar4 + 2;
  if ((long *)*plVar4 == plVar13) {
    local_260 = *plVar13;
    lStack_258 = plVar4[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *plVar13;
    local_270 = (long *)*plVar4;
  }
  local_268 = plVar4[1];
  *plVar4 = (long)plVar13;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_270);
  puVar10 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = plVar4[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
    local_310 = (ulong *)*plVar4;
  }
  local_308 = plVar4[1];
  *plVar4 = (long)puVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct((ulong)&local_2b0,'\x03');
  uVar17 = 0xf;
  if (local_310 != &local_300) {
    uVar17 = local_300;
  }
  if (uVar17 < (ulong)(local_2a8 + local_308)) {
    uVar17 = 0xf;
    if (local_2b0 != local_2a0) {
      uVar17 = local_2a0[0];
    }
    if (uVar17 < (ulong)(local_2a8 + local_308)) goto LAB_001f4515;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_310);
  }
  else {
LAB_001f4515:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_2b0);
  }
  local_350 = &local_340;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_340 = *puVar1;
    uStack_338 = puVar5[3];
  }
  else {
    local_340 = *puVar1;
    local_350 = (undefined8 *)*puVar5;
  }
  local_348 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_350);
  local_290 = &local_280;
  plVar13 = plVar4 + 2;
  if ((long *)*plVar4 == plVar13) {
    local_280 = *plVar13;
    lStack_278 = plVar4[3];
  }
  else {
    local_280 = *plVar13;
    local_290 = (long *)*plVar4;
  }
  local_288 = plVar4[1];
  *plVar4 = (long)plVar13;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_290);
  puVar10 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar10) {
    local_380 = *puVar10;
    lStack_378 = plVar4[3];
    local_390 = &local_380;
  }
  else {
    local_380 = *puVar10;
    local_390 = (ulong *)*plVar4;
  }
  local_388 = plVar4[1];
  *plVar4 = (long)puVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_370 = local_360;
  std::__cxx11::string::_M_construct((ulong)&local_370,'\x03');
  uVar17 = 0xf;
  if (local_390 != &local_380) {
    uVar17 = local_380;
  }
  if (uVar17 < (ulong)(local_368 + local_388)) {
    uVar17 = 0xf;
    if (local_370 != local_360) {
      uVar17 = local_360[0];
    }
    if (uVar17 < (ulong)(local_368 + local_388)) goto LAB_001f46cc;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_370,0,(char *)0x0,(ulong)local_390);
  }
  else {
LAB_001f46cc:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_390,(ulong)local_370);
  }
  local_330 = &local_320;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_320 = *puVar1;
    uStack_318 = puVar5[3];
  }
  else {
    local_320 = *puVar1;
    local_330 = (undefined8 *)*puVar5;
  }
  local_328 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_330);
  local_3b0 = &local_3a0;
  plVar13 = plVar4 + 2;
  if ((long *)*plVar4 == plVar13) {
    local_3a0 = *plVar13;
    lStack_398 = plVar4[3];
  }
  else {
    local_3a0 = *plVar13;
    local_3b0 = (long *)*plVar4;
  }
  local_3a8 = plVar4[1];
  *plVar4 = (long)plVar13;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_3b0);
  local_3d0 = &local_3c0;
  puVar10 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar10) {
    local_3c0 = *puVar10;
    lStack_3b8 = plVar4[3];
  }
  else {
    local_3c0 = *puVar10;
    local_3d0 = (ulong *)*plVar4;
  }
  local_3c8 = plVar4[1];
  *plVar4 = (long)puVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_2d0 = local_2c0;
  std::__cxx11::string::_M_construct((ulong)&local_2d0,'\x03');
  uVar17 = 0xf;
  if (local_3d0 != &local_3c0) {
    uVar17 = local_3c0;
  }
  if (uVar17 < (ulong)(local_2c8 + local_3c8)) {
    uVar17 = 0xf;
    if (local_2d0 != local_2c0) {
      uVar17 = local_2c0[0];
    }
    if (uVar17 < (ulong)(local_2c8 + local_3c8)) goto LAB_001f488a;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_3d0);
  }
  else {
LAB_001f488a:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3d0,(ulong)local_2d0);
  }
  local_3f0 = &local_3e0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_3e0 = *plVar4;
    lStack_3d8 = puVar5[3];
  }
  else {
    local_3e0 = *plVar4;
    local_3f0 = (long *)*puVar5;
  }
  local_3e8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_3f0);
  local_410 = &local_400;
  puVar10 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar10) {
    local_400 = *puVar10;
    lStack_3f8 = plVar4[3];
  }
  else {
    local_400 = *puVar10;
    local_410 = (ulong *)*plVar4;
  }
  local_408 = plVar4[1];
  *plVar4 = (long)puVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_2f0 = local_2e0;
  std::__cxx11::string::_M_construct((ulong)&local_2f0,'\x03');
  uVar17 = 0xf;
  if (local_410 != &local_400) {
    uVar17 = local_400;
  }
  if (uVar17 < (ulong)(local_2e8 + local_408)) {
    uVar17 = 0xf;
    if (local_2f0 != local_2e0) {
      uVar17 = local_2e0[0];
    }
    if ((ulong)(local_2e8 + local_408) <= uVar17) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,(ulong)local_410);
      goto LAB_001f49d7;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_2f0);
LAB_001f49d7:
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  psVar11 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_430.field_2._M_allocated_capacity = *psVar11;
    local_430.field_2._8_8_ = puVar5[3];
  }
  else {
    local_430.field_2._M_allocated_capacity = *psVar11;
    local_430._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_430._M_string_length = puVar5[1];
  *puVar5 = psVar11;
  puVar5[1] = 0;
  *(undefined1 *)psVar11 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_430);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  psVar11 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_458.field_2._M_allocated_capacity = *psVar11;
    local_458.field_2._8_8_ = plVar4[3];
  }
  else {
    local_458.field_2._M_allocated_capacity = *psVar11;
    local_458._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_458._M_string_length = plVar4[1];
  *plVar4 = (long)psVar11;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,local_458._M_dataplus._M_p,local_458._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0);
  }
  if (local_410 != &local_400) {
    operator_delete(local_410);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0);
  }
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0);
  }
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_370 != local_360) {
    operator_delete(local_370);
  }
  if (local_390 != &local_380) {
    operator_delete(local_390);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0]);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _error_with_option_name;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void CppGenerator::genMainFunction(bool parallelize)
{
    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"main.cpp",std::ofstream::out);

    ofs << "#ifdef TESTING \n"+offset(1)+"#include <iomanip>\n"+"#endif\n";
    
    ofs << "#include \"DataHandler.h\"\n";
    for (size_t group = 0; group < viewGroups.size(); ++group)
        ofs << "#include \"ComputeGroup"+std::to_string(group)+".h\"\n";

    if (_hasApplicationHandler)
        ofs << "#include \"ApplicationHandler.h\"\n";
    
    ofs << "\nnamespace lmfao\n{\n";    
    // offset(1)+"//const std::std::ring PATH_TO_DATA = \"/Users/Maximilian/Documents/"+
    // "Oxford/LMFAO/"+_pathToData+"\";\n"+
    // offset(1)+"const std::string PATH_TO_DATA = \"../../"+_pathToData+"\";\n\n";

    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
    {
        const std::string& relName = _td->getRelation(relID)->_name;
        ofs << offset(1)+"std::vector<"+relName+"_tuple> "+relName+";" << std::endl;
    }
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        ofs << offset(1)+"std::vector<"+viewName[viewID]+"_tuple> "+
            viewName[viewID]+";" << std::endl;
    }
    
    ofs << genLoadRelationFunction() << std::endl;

    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
        ofs << genSortFunction(relID) << std::endl;
    
    ofs << genRunFunction(parallelize) << std::endl;
    ofs << genTestFunction() << genDumpFunction() << "}\n\n";
 
    ofs << "int main(int argc, char *argv[])\n{\n"+
        offset(1)+"std::cout << \"run lmfao\" << std::endl;\n"+
        offset(1)+"lmfao::run();\n"+
        "#ifdef TESTING\n"+offset(1)+"lmfao::ouputViewsForTesting();\n#endif\n"+
        "#ifdef DUMP_OUTPUT\n"+offset(1)+"lmfao::dumpOutputViews();\n#endif\n"+
        offset(1)+"return 0;\n};\n";
    ofs.close();
}